

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

walk_result __thiscall
jsoncons::jsonschema::
minimum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_walk(minimum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *param_2,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
       json_pointer *instance_location,walk_reporter_type *reporter)

{
  walk_result wVar1;
  uri *__args_2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *__args_1;
  function<jsoncons::jsonschema::walk_result_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::uri_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::jsonpointer::basic_json_pointer<char>_&)>
  *in_RCX;
  keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  
  __args = in_R8;
  __args_2 = (uri *)keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ::keyword_name_abi_cxx11_
                              ((keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                                *)in_RDI);
  __args_1 = keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             ::schema(in_RDI);
  (*(in_RDI->super_validation_message_factory)._vptr_validation_message_factory[6])();
  wVar1 = std::
          function<jsoncons::jsonschema::walk_result_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::uri_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::jsonpointer::basic_json_pointer<char>_&)>
          ::operator()(in_RCX,__args,__args_1,__args_2,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_R8,
                       (basic_json_pointer<char> *)in_RDI);
  return wVar1;
}

Assistant:

walk_result do_walk(const eval_context<Json>& /*context*/, const Json& instance,
            const jsonpointer::json_pointer& instance_location, const walk_reporter_type& reporter) const final
        {
            return reporter(this->keyword_name(), this->schema(), this->schema_location(), instance, instance_location);
        }